

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Real Omega_h::get_metric_scalar_for_nelems(Int elem_dim,Real expected_nelems,Real target_nelems)

{
  double dVar1;
  Real RVar2;
  
  RVar2 = target_nelems / expected_nelems;
  if (elem_dim != 3) {
    if (elem_dim != 2) {
      if (elem_dim == 1) {
        RVar2 = RVar2 * RVar2;
      }
      else {
        RVar2 = -1.0;
      }
    }
    return RVar2;
  }
  dVar1 = cbrt(RVar2 * RVar2);
  return dVar1;
}

Assistant:

Real get_metric_scalar_for_nelems(
    Int elem_dim, Real expected_nelems, Real target_nelems) {
  auto size_scal = target_nelems / expected_nelems;
  auto metric_scal = power(size_scal, 2, elem_dim);
  return metric_scal;
}